

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

optional<std::vector<Token,_std::allocator<Token>_>_> * __thiscall
Parser::extractMacroParameter
          (optional<std::vector<Token,_std::allocator<Token>_>_> *__return_storage_ptr__,
          Parser *this,Token *macroStart)

{
  TokenType TVar1;
  Tokenizer *pTVar2;
  Token *pTVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  vector<Token,_std::allocator<Token>_> tokens;
  vector<Token,_std::allocator<Token>_> local_58;
  iterator local_38;
  
  pTVar2 = (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer;
  local_38._M_node = (pTVar2->position).it._M_node;
  iVar4 = 0;
  pTVar3 = Tokenizer::peekToken(pTVar2,0);
  if (pTVar3->type != Separator) {
    iVar6 = 0;
    iVar5 = 0;
    do {
      pTVar3 = Tokenizer::peekToken
                         ((this->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
      TVar1 = pTVar3->type;
      if ((((TVar1 == Comma) && (iVar4 == 0)) && (iVar6 == 0)) && (iVar5 == 0)) goto LAB_001474e1;
      switch(TVar1) {
      case LBrack:
        iVar5 = iVar5 + 1;
        break;
      case RBrack:
        iVar5 = iVar5 + -1;
        break;
      case Comma:
      case Assign:
      case Equ:
      case EquValue:
      case Hash:
        break;
      case LBrace:
        iVar6 = iVar6 + 1;
        break;
      case RBrace:
        iVar6 = iVar6 + -1;
        break;
      default:
        if (TVar1 == RParen) {
          iVar4 = iVar4 + -1;
        }
        else if (TVar1 == LParen) {
          iVar4 = iVar4 + 1;
        }
      }
      Tokenizer::eatTokens
                ((this->entries).
                 super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].tokenizer,1);
      pTVar3 = Tokenizer::peekToken
                         ((this->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
    } while (pTVar3->type != Separator);
    if (iVar4 != 0) {
      printError<>(this,macroStart,"Unbalanced parentheses in macro parameter");
      (__return_storage_ptr__->
      super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>)._M_payload.
      super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
      super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_engaged = false;
      return __return_storage_ptr__;
    }
  }
LAB_001474e1:
  pTVar2 = (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer;
  Tokenizer::getTokens
            (&local_58,pTVar2,(TokenizerPosition)local_38._M_node,
             (TokenizerPosition)(pTVar2->position).it._M_node);
  bVar7 = local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data
          ._M_finish ==
          local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data
          ._M_start;
  if (bVar7) {
    printError<>(this,macroStart,"Empty macro argument");
  }
  else {
    *(pointer *)
     &(__return_storage_ptr__->
      super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>)._M_payload.
      super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
      super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_payload._M_value.
      super__Vector_base<Token,_std::allocator<Token>_>._M_impl =
         local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
         _M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>).
             _M_payload.
             super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>
             .super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_payload.
             _M_value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl + 8) =
         local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>).
             _M_payload.
             super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>
             .super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_payload.
             _M_value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl + 0x10) =
         local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  (__return_storage_ptr__->
  super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>)._M_payload.
  super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
  super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_engaged = !bVar7;
  std::vector<Token,_std::allocator<Token>_>::~vector(&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<Token>> Parser::extractMacroParameter(const Token &macroStart)
{
	TokenizerPosition startPos = getTokenizer()->getPosition();

	// Find the end of the parameter. The parameter may contain expressions with function calls,
	// so keep track of the current parenthesis depth level
	int parenCount = 0;
	int braceCount = 0;
	int bracketCount = 0;

	while (peekToken().type != TokenType::Separator)
	{
		// if the next token is a comma, only exit the loop if parentheses are balanced
		auto type = peekToken().type;
		if (type == TokenType::Comma && parenCount == 0 && braceCount == 0 && bracketCount == 0)
			break;

		// keep track of parenthesis depth
		switch (type)
		{
		case TokenType::LParen:
			++parenCount;
			break;
		case TokenType::RParen:
			--parenCount;
			break;
		case TokenType::LBrace:
			++braceCount;
			break;
		case TokenType::RBrace:
			--braceCount;
			break;
		case TokenType::LBrack:
			++bracketCount;
			break;
		case TokenType::RBrack:
			--bracketCount;
			break;
		default:
			break;
		}

		eatToken();
	}

	if (parenCount != 0)
	{
		printError(macroStart, "Unbalanced parentheses in macro parameter");
		return std::nullopt;
	}

	TokenizerPosition endPos = getTokenizer()->getPosition();
	std::vector<Token> tokens = getTokenizer()->getTokens(startPos,endPos);
	if (tokens.size() == 0)
	{
		printError(macroStart, "Empty macro argument");
		return std::nullopt;
	}

	return tokens;
}